

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

ShaderResourceUsage *
deqp::gles31::Functional::getShaderResourceUsage
          (ShaderResourceUsage *__return_storage_ptr__,Program *program,Shader *shader)

{
  ShaderType SVar1;
  pointer pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  deUint32 dVar11;
  long lVar12;
  _func_int_DataType *dTypeMap;
  Shader *shader_00;
  int varNdx;
  long lVar13;
  int retVal;
  
  iVar3 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_IN);
  __return_storage_ptr__->numInputs = iVar3;
  iVar4 = anon_unknown_3::getNumVectors(shader,STORAGE_IN);
  __return_storage_ptr__->numInputVectors = iVar4;
  iVar5 = anon_unknown_3::getNumComponents(shader,STORAGE_IN);
  __return_storage_ptr__->numInputComponents = iVar5;
  iVar6 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_OUT);
  __return_storage_ptr__->numOutputs = iVar6;
  iVar7 = anon_unknown_3::getNumVectors(shader,STORAGE_OUT);
  __return_storage_ptr__->numOutputVectors = iVar7;
  iVar8 = anon_unknown_3::getNumComponents(shader,STORAGE_OUT);
  __return_storage_ptr__->numOutputComponents = iVar8;
  iVar9 = anon_unknown_3::getNumComponents(shader,STORAGE_PATCH_IN);
  __return_storage_ptr__->numPatchInputComponents = iVar9;
  dTypeMap = (_func_int_DataType *)0x6;
  iVar9 = anon_unknown_3::getNumComponents(shader,STORAGE_PATCH_OUT);
  __return_storage_ptr__->numPatchOutputComponents = iVar9;
  lVar12 = 0x20;
  iVar9 = 0;
  for (lVar13 = 0;
      pVVar2 = (shader->m_defaultBlock).variables.
               super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar13 < (int)(((long)(shader->m_defaultBlock).variables.
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x60);
      lVar13 = lVar13 + 1) {
    if (*(int *)((long)pVVar2 + lVar12 + -8) == 3) {
      iVar10 = (anonymous_namespace)::accumulateComplexType<int(glu::DataType)>
                         ((VarType *)((long)&(pVVar2->layout).location + lVar12),dTypeMap);
      iVar9 = iVar9 + iVar10;
    }
    lVar12 = lVar12 + 0x60;
  }
  __return_storage_ptr__->numDefaultBlockUniformComponents = iVar9;
  iVar9 = anon_unknown_3::getNumComponents(shader,STORAGE_UNIFORM);
  __return_storage_ptr__->numCombinedUniformComponents = iVar9;
  iVar9 = anon_unknown_3::getNumVectors(shader,STORAGE_UNIFORM);
  __return_storage_ptr__->numUniformVectors = iVar9;
  iVar9 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeSampler);
  __return_storage_ptr__->numSamplers = iVar9;
  shader_00 = (Shader *)0x3;
  iVar9 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeImage);
  __return_storage_ptr__->numImages = iVar9;
  iVar9 = anon_unknown_3::getNumAtomicCounterBuffers((anon_unknown_3 *)shader,shader_00);
  __return_storage_ptr__->numAtomicCounterBuffers = iVar9;
  iVar9 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeAtomicCounter);
  __return_storage_ptr__->numAtomicCounters = iVar9;
  iVar9 = anon_unknown_3::getNumShaderBlocks(shader,STORAGE_UNIFORM);
  __return_storage_ptr__->numUniformBlocks = iVar9;
  iVar9 = anon_unknown_3::getNumShaderBlocks(shader,STORAGE_BUFFER);
  __return_storage_ptr__->numShaderStorageBlocks = iVar9;
  SVar1 = shader->m_shaderType;
  if (SVar1 == SHADERTYPE_TESSELLATION_EVALUATION) {
    dVar11 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputs = dVar11 + iVar3;
    dVar11 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputVectors = dVar11 + iVar4;
    dVar11 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputComponents = iVar5 + dVar11 * 4;
  }
  else {
    if (SVar1 == SHADERTYPE_TESSELLATION_CONTROL) {
      dVar11 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      __return_storage_ptr__->numInputs = dVar11 + iVar3;
      dVar11 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      __return_storage_ptr__->numInputVectors = dVar11 + iVar4;
      dVar11 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      __return_storage_ptr__->numInputComponents = iVar5 + dVar11 * 4;
      dVar11 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      __return_storage_ptr__->numOutputs = dVar11 + iVar6;
      dVar11 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      __return_storage_ptr__->numOutputVectors = dVar11 + iVar7;
      dVar11 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      iVar8 = iVar8 + dVar11 * 4;
      goto LAB_005da3b3;
    }
    if (SVar1 != SHADERTYPE_GEOMETRY) {
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->numInputs = iVar3 + 1;
    __return_storage_ptr__->numInputVectors = iVar4 + 1;
    __return_storage_ptr__->numInputComponents = iVar5 + 4;
  }
  __return_storage_ptr__->numOutputs = iVar6 + 1;
  __return_storage_ptr__->numOutputVectors = iVar7 + 1;
  iVar8 = iVar8 + 4;
LAB_005da3b3:
  __return_storage_ptr__->numOutputComponents = iVar8;
  return __return_storage_ptr__;
}

Assistant:

ProgramInterfaceDefinition::ShaderResourceUsage getShaderResourceUsage (const ProgramInterfaceDefinition::Program* program, const ProgramInterfaceDefinition::Shader* shader)
{
	ProgramInterfaceDefinition::ShaderResourceUsage retVal;

	retVal.numInputs						= getNumTypeInstances(shader, glu::STORAGE_IN);
	retVal.numInputVectors					= getNumVectors(shader, glu::STORAGE_IN);
	retVal.numInputComponents				= getNumComponents(shader, glu::STORAGE_IN);

	retVal.numOutputs						= getNumTypeInstances(shader, glu::STORAGE_OUT);
	retVal.numOutputVectors					= getNumVectors(shader, glu::STORAGE_OUT);
	retVal.numOutputComponents				= getNumComponents(shader, glu::STORAGE_OUT);

	retVal.numPatchInputComponents			= getNumComponents(shader, glu::STORAGE_PATCH_IN);
	retVal.numPatchOutputComponents			= getNumComponents(shader, glu::STORAGE_PATCH_OUT);

	retVal.numDefaultBlockUniformComponents	= getNumDefaultBlockComponents(shader, glu::STORAGE_UNIFORM);
	retVal.numCombinedUniformComponents		= getNumComponents(shader, glu::STORAGE_UNIFORM);
	retVal.numUniformVectors				= getNumVectors(shader, glu::STORAGE_UNIFORM);

	retVal.numSamplers						= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeSampler);
	retVal.numImages						= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeImage);

	retVal.numAtomicCounterBuffers			= getNumAtomicCounterBuffers(shader);
	retVal.numAtomicCounters				= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeAtomicCounter);

	retVal.numUniformBlocks					= getNumShaderBlocks(shader, glu::STORAGE_UNIFORM);
	retVal.numShaderStorageBlocks			= getNumShaderBlocks(shader, glu::STORAGE_BUFFER);

	// add builtins
	switch (shader->getType())
	{
		case glu::SHADERTYPE_VERTEX:
			// gl_Position is not counted
			break;

		case glu::SHADERTYPE_FRAGMENT:
			// nada
			break;

		case glu::SHADERTYPE_GEOMETRY:
			// gl_Position in (point mode => size 1)
			retVal.numInputs			+= 1;
			retVal.numInputVectors		+= 1;
			retVal.numInputComponents	+= 4;

			// gl_Position out
			retVal.numOutputs			+= 1;
			retVal.numOutputVectors		+= 1;
			retVal.numOutputComponents	+= 4;
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
			// gl_Position in is read up to gl_InstanceID
			retVal.numInputs			+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputVectors		+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputComponents	+= 4 * program->getTessellationNumOutputPatchVertices();

			// gl_Position out, size = num patch out vertices
			retVal.numOutputs			+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numOutputVectors		+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numOutputComponents	+= 4 * program->getTessellationNumOutputPatchVertices();
			break;

		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			// gl_Position in is read up to gl_InstanceID
			retVal.numInputs			+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputVectors		+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputComponents	+= 4 * program->getTessellationNumOutputPatchVertices();

			// gl_Position out
			retVal.numOutputs			+= 1;
			retVal.numOutputVectors		+= 1;
			retVal.numOutputComponents	+= 4;
			break;

		case glu::SHADERTYPE_COMPUTE:
			// nada
			break;

		default:
			DE_ASSERT(false);
			break;
	}
	return retVal;
}